

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O2

int testRST(int argc,char **argv)

{
  bool bVar1;
  bool ret;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool a_eol;
  bool e_eol;
  string fname;
  string a_line;
  string dir;
  string a_name;
  string local_f98;
  string e_name;
  ifstream a_fin;
  streambuf local_f48 [16];
  byte abStack_f38 [488];
  ifstream e_fin;
  byte abStack_d30 [3328];
  
  if (argc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: testRST <dir>");
    std::endl<char,std::char_traits<char>>(poVar3);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dir,argv[1],(allocator<char> *)&e_fin);
  if (dir._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&dir);
  }
  this = &a_name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,"testRST.actual",(allocator<char> *)&e_fin);
  std::operator+(&e_name,&dir,"/testRST.expect");
  std::operator+(&fname,&dir,"/testRST.rst");
  std::ofstream::ofstream(&a_fin,a_name._M_dataplus._M_p,_S_out);
  if ((abStack_f38[*(long *)(_a_fin + -0x18)] & 5) == 0) {
    std::__cxx11::string::string((string *)&local_f98,(string *)&dir);
    cmRST::cmRST((cmRST *)&e_fin,(ostream *)&a_fin,&local_f98);
    std::__cxx11::string::~string((string *)&local_f98);
    bVar1 = cmRST::ProcessFile((cmRST *)&e_fin,&fname,false);
    if (bVar1) {
      cmRST::~cmRST((cmRST *)&e_fin);
      std::ofstream::~ofstream(&a_fin);
      std::__cxx11::string::~string((string *)&fname);
      std::ifstream::ifstream(&e_fin,e_name._M_dataplus._M_p,_S_in);
      std::ifstream::ifstream(&a_fin,a_name._M_dataplus._M_p,_S_in);
      if ((abStack_d30[*(long *)&_e_fin[-1].field_0xf8] & 5) == 0) {
        if ((abStack_f38[*(long *)(_a_fin + -0x18)] & 5) != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Could not open input ");
          goto LAB_001379e4;
        }
        iVar4 = 1;
        do {
          fname._M_dataplus._M_p = (pointer)&fname.field_2;
          fname._M_string_length = 0;
          fname.field_2._M_local_buf[0] = '\0';
          a_line._M_dataplus._M_p = (pointer)&a_line.field_2;
          a_line._M_string_length = 0;
          a_line.field_2._M_local_buf[0] = '\0';
          bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&e_fin,&fname,&e_eol,-1);
          ret = cmsys::SystemTools::GetLineFromStream((istream *)&a_fin,&a_line,&a_eol,-1);
          if (((bVar1 != ret) || (bVar2 = std::operator!=(&fname,&a_line), bVar2)) ||
             (e_eol != a_eol)) {
            std::istream::seekg((long)&a_fin,_S_beg);
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     "Actual output does not match that expected on line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
            poVar3 = std::operator<<(poVar3,".");
            poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
            std::operator<<(poVar3,"Expected ");
            reportLine((ostream *)&std::cerr,bVar1,&fname,e_eol);
            std::operator<<((ostream *)&std::cerr," but got ");
            reportLine((ostream *)&std::cerr,ret,&a_line,a_eol);
            poVar3 = std::operator<<((ostream *)&std::cerr,".");
            poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<(poVar3,"Actual output:");
            poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
            std::ostream::operator<<(poVar3,local_f48);
            std::__cxx11::string::~string((string *)&a_line);
            std::__cxx11::string::~string((string *)&fname);
            goto LAB_001379f7;
          }
          std::__cxx11::string::~string((string *)&a_line);
          std::__cxx11::string::~string((string *)&fname);
          iVar4 = iVar4 + 1;
        } while (bVar1 && ret);
        iVar4 = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Could not open input ");
        this = &e_name;
LAB_001379e4:
        poVar3 = std::operator<<(poVar3,(string *)this);
        std::endl<char,std::char_traits<char>>(poVar3);
LAB_001379f7:
        iVar4 = 1;
      }
      std::ifstream::~ifstream(&a_fin);
      std::ifstream::~ifstream(&e_fin);
      goto LAB_00137983;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not open input ");
    poVar3 = std::operator<<(poVar3,(string *)&fname);
    std::endl<char,std::char_traits<char>>(poVar3);
    cmRST::~cmRST((cmRST *)&e_fin);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not open output ");
    poVar3 = std::operator<<(poVar3,(string *)&a_name);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::~ofstream(&a_fin);
  std::__cxx11::string::~string((string *)&fname);
  iVar4 = 1;
LAB_00137983:
  std::__cxx11::string::~string((string *)&e_name);
  std::__cxx11::string::~string((string *)&a_name);
  std::__cxx11::string::~string((string *)&dir);
  return iVar4;
}

Assistant:

int testRST(int argc, char* argv[])
{
  if (argc != 2) {
    std::cerr << "Usage: testRST <dir>" << std::endl;
    return 1;
  }
  std::string dir = argv[1];
  if (dir.empty()) {
    dir = ".";
  }
  std::string a_name = "testRST.actual";
  std::string e_name = dir + "/testRST.expect";

  // Process the test RST file.
  {
    std::string fname = dir + "/testRST.rst";
    std::ofstream fout(a_name.c_str());
    if (!fout) {
      std::cerr << "Could not open output " << a_name << std::endl;
      return 1;
    }

    cmRST r(fout, dir);
    if (!r.ProcessFile(fname)) {
      std::cerr << "Could not open input " << fname << std::endl;
      return 1;
    }
  }

  // Compare expected and actual outputs.
  cmsys::ifstream e_fin(e_name.c_str());
  cmsys::ifstream a_fin(a_name.c_str());
  if (!e_fin) {
    std::cerr << "Could not open input " << e_name << std::endl;
    return 1;
  }
  if (!a_fin) {
    std::cerr << "Could not open input " << a_name << std::endl;
    return 1;
  }
  int lineno = 0;
  bool e_ret;
  bool a_ret;
  do {
    std::string e_line;
    std::string a_line;
    bool e_eol;
    bool a_eol;
    e_ret = cmSystemTools::GetLineFromStream(e_fin, e_line, &e_eol);
    a_ret = cmSystemTools::GetLineFromStream(a_fin, a_line, &a_eol);
    ++lineno;
    if (e_ret != a_ret || e_line != a_line || e_eol != a_eol) {
      a_fin.seekg(0, std::ios::beg);
      std::cerr << "Actual output does not match that expected on line "
                << lineno << "." << std::endl
                << "Expected ";
      reportLine(std::cerr, e_ret, e_line, e_eol);
      std::cerr << " but got ";
      reportLine(std::cerr, a_ret, a_line, a_eol);
      std::cerr << "." << std::endl
                << "Actual output:" << std::endl
                << a_fin.rdbuf();
      return 1;
    }
  } while (e_ret && a_ret);
  return 0;
}